

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.cpp
# Opt level: O2

void mapAddIsland(Layer *l,int *out,longlong areaX,longlong areaZ,int areaWidth,int areaHeight)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  char cVar16;
  ulong uVar17;
  long lVar18;
  int *piVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  long lVar23;
  int *local_68;
  int64_t chunkZ;
  int *local_48;
  
  (*l->p->getMap)(l->p,out,(long)((int)areaX + -1),(long)((int)areaZ + -1),areaWidth + 2,
                  areaHeight + 2);
  lVar5 = l->worldSeed;
  lVar1 = lVar5 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  uVar14 = 0;
  if (0 < areaWidth) {
    uVar14 = (ulong)(uint)areaWidth;
  }
  lVar10 = (long)areaWidth;
  uVar12 = (ulong)(uint)areaHeight;
  if (areaHeight < 1) {
    uVar12 = 0;
  }
  piVar19 = out + lVar10 * 2 + 6;
  lVar20 = lVar1 * lVar5 + areaX;
  local_68 = out + lVar10 + 3;
  uVar17 = 0;
  local_48 = out;
  do {
    if (uVar17 == uVar12) {
      return;
    }
    lVar18 = uVar17 + areaZ;
    lVar23 = areaX * 0x5851f42d4c957f2d + 0x14057b7ef767814f + lVar1 * lVar5 * 0x5851f42d4c957f2d;
    for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
      iVar2 = out[uVar15];
      iVar3 = out[uVar15 + 2];
      iVar4 = piVar19[uVar15 - 2];
      iVar21 = piVar19[uVar15];
      iVar8 = local_68[uVar15];
      if (iVar8 == 0) {
        if ((((iVar2 != 0) || (iVar3 != 0)) || (iVar4 != 0)) || (iVar21 != 0)) {
          lVar9 = (lVar20 + uVar15) * lVar23 + lVar18;
          lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + areaX + uVar15;
          uVar22 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + lVar18;
          if (iVar2 == 0) {
            iVar13 = 1;
          }
          else {
            uVar22 = (uVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar22 + lVar5;
            iVar13 = iVar2;
          }
          cVar16 = iVar2 != 0;
          if (iVar3 != 0) {
            cVar16 = cVar16 + '\x01';
            if ((uVar22 & 0x1000000) == 0) {
              iVar13 = iVar3;
            }
            if (iVar2 == 0) {
              iVar13 = iVar3;
            }
            uVar22 = (uVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar22 + lVar5;
          }
          iVar8 = iVar13;
          if (iVar4 != 0) {
            iVar8 = iVar4;
            if (cVar16 != '\0') {
              if (cVar16 == '\x01') {
                if (((uint)uVar22 >> 0x18 & 1) != 0) {
                  iVar8 = iVar13;
                }
              }
              else if (((long)uVar22 >> 0x18) % 3 != 0) {
                iVar8 = iVar13;
              }
            }
            cVar16 = cVar16 + '\x01';
            uVar22 = (uVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar22 + lVar5;
          }
          if (iVar21 != 0) {
            if (cVar16 != '\0') {
              if (cVar16 == '\x02') {
                uVar11 = ((long)uVar22 >> 0x18) % 3;
              }
              else {
                if (cVar16 == '\x01') {
                  if (((uint)uVar22 >> 0x18 & 1) != 0) {
                    iVar21 = iVar8;
                  }
                  goto LAB_00104f29;
                }
                uVar11 = uVar22 & 0x3000000;
              }
              if (uVar11 != 0) {
                iVar21 = iVar8;
              }
            }
LAB_00104f29:
            uVar22 = (uVar22 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * uVar22 + lVar5;
            iVar8 = iVar21;
          }
          auVar7._8_8_ = (long)uVar22 >> 0x3f;
          auVar7._0_8_ = (long)uVar22 >> 0x18;
          if (SUB168(auVar7 % SEXT816(3),0) != 0) {
            iVar8 = (uint)(iVar8 == 4) << 2;
          }
        }
      }
      else if ((0 < iVar8) &&
              ((((iVar2 == 0 || (iVar3 == 0)) || ((iVar4 == 0 || (iVar21 == 0)))) &&
               (lVar9 = (lVar20 + uVar15) * lVar23 + lVar18,
               lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + areaX + uVar15,
               lVar9 = (lVar9 * 0x5851f42d4c957f2d + 0x14057b7ef767814f) * lVar9 + lVar18,
               auVar6._8_8_ = lVar9 >> 0x3f, auVar6._0_8_ = lVar9 >> 0x18,
               SUB168(auVar6 % SEXT816(5),0) == 0)))) {
        iVar8 = (uint)(iVar8 == 4) << 2;
      }
      local_48[uVar15] = iVar8;
      lVar23 = lVar23 + 0x5851f42d4c957f2d;
    }
    local_48 = local_48 + lVar10;
    piVar19 = piVar19 + lVar10 + 2;
    out = out + lVar10 + 2;
    local_68 = local_68 + lVar10 + 2;
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void mapAddIsland(Layer *l, int *__restrict out, long long areaX, long long areaZ, int areaWidth, int areaHeight) {
    int pX = (int)areaX - 1;
    int pZ = (int)areaZ - 1;
    int pWidth = areaWidth + 2;
    int pHeight = areaHeight + 2;
    int x, z;

    l->p->getMap(l->p, out, pX, pZ, pWidth, pHeight);

    const int64_t ws = l->worldSeed;
    const int64_t ss = ws * (ws * 6364136223846793005LL + 1442695040888963407LL);

    for (z = 0; z < areaHeight; z++) {
        for (x = 0; x < areaWidth; x++) {
            int v00 = out[x + 0 + (z + 0) * pWidth];
            int v20 = out[x + 2 + (z + 0) * pWidth];
            int v02 = out[x + 0 + (z + 2) * pWidth];
            int v22 = out[x + 2 + (z + 2) * pWidth];
            int v11 = out[x + 1 + (z + 1) * pWidth];

            if (v11 == 0 && (v00 != 0 || v20 != 0 || v02 != 0 || v22 != 0)) {
                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);
                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                int v = 1;
                int inc = 0;

                if (v00 != 0) {
                    ++inc;
                    v = v00;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v20 != 0) {
                    if (++inc == 1 || (cs & (1LL << 24)) == 0) v = v20;
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v02 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v02;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v02;
                            break;
                        default:
                            if (((cs >> 24) % 3) == 0) v = v02;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }
                if (v22 != 0) {
                    switch (++inc) {
                        case 1:
                            v = v22;
                            break;
                        case 2:
                            if ((cs & (1LL << 24)) == 0) v = v22;
                            break;
                        case 3:
                            if (((cs >> 24) % 3) == 0) v = v22;
                            break;
                        default:
                            if ((cs & (3LL << 24)) == 0) v = v22;
                    }
                    cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                    cs += ws;
                }

                if ((cs >> 24) % 3 == 0)
                    out[x + z * areaWidth] = v;
                else if (v == 4)
                    out[x + z * areaWidth] = 4;
                else
                    out[x + z * areaWidth] = 0;
            } else if (v11 > 0 && (v00 == 0 || v20 == 0 || v02 == 0 || v22 == 0)) {
                //setChunkSeed(l, (int64_t)(x + areaX), (int64_t)(z + areaZ));
                //if (mcNextInt(l, 5) == 0)...

                const auto chunkX = (int64_t) (x + areaX);
                const auto chunkZ = (int64_t) (z + areaZ);

                int64_t cs = ss;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkX;
                cs *= cs * 6364136223846793005LL + 1442695040888963407LL;
                cs += chunkZ;

                if ((cs >> 24) % 5 == 0)
                    out[x + z * areaWidth] = (v11 == 4) ? 4 : 0;
                else
                    out[x + z * areaWidth] = v11;
            } else {
                out[x + z * areaWidth] = v11;
            }
        }
    }
}